

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::anon_unknown_36::WebSocketPipeImpl::abort(WebSocketPipeImpl *this)

{
  WebSocket *pWVar1;
  Disposer *pDVar2;
  PromiseFulfiller<void> *pPVar3;
  WebSocket *pWVar4;
  undefined1 local_9;
  
  pWVar1 = (this->state).ptr;
  if (pWVar1 != (WebSocket *)0x0) {
    (*pWVar1->_vptr_WebSocket[4])();
    return;
  }
  pWVar4 = (WebSocket *)operator_new(8);
  pWVar4->_vptr_WebSocket = (_func_int **)&PTR_send_007034e0;
  pDVar2 = (this->ownState).disposer;
  pWVar1 = (this->ownState).ptr;
  (this->ownState).disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted>::instance;
  (this->ownState).ptr = pWVar4;
  if (pWVar1 != (WebSocket *)0x0) {
    (**pDVar2->_vptr_Disposer)(pDVar2,pWVar1->_vptr_WebSocket[-2] + (long)&pWVar1->_vptr_WebSocket);
  }
  (this->state).ptr = (this->ownState).ptr;
  this->aborted = true;
  if ((this->abortedFulfiller).ptr.ptr != (PromiseFulfiller<void> *)0x0) {
    pPVar3 = (this->abortedFulfiller).ptr.ptr;
    (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_9);
    pDVar2 = (this->abortedFulfiller).ptr.disposer;
    pPVar3 = (this->abortedFulfiller).ptr.ptr;
    (this->abortedFulfiller).ptr.disposer = (Disposer *)0x0;
    (this->abortedFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector);
    }
  }
  return;
}

Assistant:

void abort() override {
    KJ_IF_SOME(s, state) {
      s.abort();
    } else {
      ownState = heap<Aborted>();
      state = *ownState;

      aborted = true;
      KJ_IF_SOME(f, abortedFulfiller) {
        f->fulfill();
        abortedFulfiller = kj::none;
      }
    }